

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O0

void __thiscall
GlobOptBlockData::RemoveUnavailableCandidates(GlobOptBlockData *this,PRECandidates *candidates)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  ValueNumber VVar4;
  ValueNumber VVar5;
  Type *ppHVar6;
  PropertySym *sym;
  ValueInfo *pVVar7;
  Sym *sym_00;
  Value *pVVar8;
  Sym *pSVar9;
  undefined4 *puVar10;
  Value *symStoreValue;
  Value *blockValue;
  Sym *symStore;
  ValueNumber valueNumber;
  PropertySym *candidatePropertySym;
  Value *candidateValue;
  GlobHashBucket **candidate;
  EditingIterator iter;
  PRECandidates *candidates_local;
  GlobOptBlockData *this_local;
  
  iter.super_EditingIterator.last = (NodeBase *)candidates;
  SList<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount>::GetEditingIterator
            ((EditingIterator *)&candidate,candidates->candidatesList);
LAB_005ef099:
  bVar2 = SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount>::
          EditingIterator::Next((EditingIterator *)&candidate);
  if (!bVar2) {
    return;
  }
  ppHVar6 = SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount>::Iterator
            ::Data((Iterator *)&candidate);
  pVVar8 = (*ppHVar6)->element;
  sym = Sym::AsPropertySym((*ppHVar6)->value);
  VVar4 = ::Value::GetValueNumber(pVVar8);
  pVVar7 = ::Value::GetValueInfo(pVVar8);
  sym_00 = ValueInfo::GetSymStore(pVVar7);
  pVVar8 = FindValue(this,&sym->super_Sym);
  if ((pVVar8 != (Value *)0x0) && (VVar5 = ::Value::GetValueNumber(pVVar8), VVar5 == VVar4))
  goto code_r0x005ef121;
  goto LAB_005ef165;
code_r0x005ef121:
  pVVar7 = ::Value::GetValueInfo(pVVar8);
  pSVar9 = ValueInfo::GetSymStore(pVVar7);
  if ((pSVar9 != sym_00) ||
     ((pVVar8 = FindValue(this,sym_00), pVVar8 == (Value *)0x0 ||
      (VVar5 = ::Value::GetValueNumber(pVVar8), VVar5 != VVar4)))) {
LAB_005ef165:
    SList<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount>::EditingIterator::
    RemoveCurrent((EditingIterator *)&candidate);
    BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                      ((BVSparse<Memory::JitArenaAllocator> *)
                       (iter.super_EditingIterator.last)->next,(sym->super_Sym).m_id);
    if (BVar3 == '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                         ,0x16d,
                         "(candidates->candidatesToProcess->Test(candidatePropertySym->m_id))",
                         "candidates->candidatesToProcess->Test(candidatePropertySym->m_id)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    BVSparse<Memory::JitArenaAllocator>::Clear
              ((BVSparse<Memory::JitArenaAllocator> *)(iter.super_EditingIterator.last)->next,
               (sym->super_Sym).m_id);
  }
  goto LAB_005ef099;
}

Assistant:

void GlobOptBlockData::RemoveUnavailableCandidates(PRECandidates * candidates)
{
    // In case of multiple back-edges to the loop, make sure the candidates are still valid.
    FOREACH_SLIST_ENTRY_EDITING(GlobHashBucket*, candidate, candidates->candidatesList, iter)
    {
        Value *candidateValue = candidate->element;
        PropertySym *candidatePropertySym = candidate->value->AsPropertySym();
        ValueNumber valueNumber = candidateValue->GetValueNumber();
        Sym *symStore = candidateValue->GetValueInfo()->GetSymStore();

        Value *blockValue = this->FindValue(candidatePropertySym);

        if (blockValue && blockValue->GetValueNumber() == valueNumber
            && blockValue->GetValueInfo()->GetSymStore() == symStore)
        {
            Value *symStoreValue = this->FindValue(symStore);

            if (symStoreValue && symStoreValue->GetValueNumber() == valueNumber)
            {
                continue;
            }
        }

        iter.RemoveCurrent();
        Assert(candidates->candidatesToProcess->Test(candidatePropertySym->m_id));
        candidates->candidatesToProcess->Clear(candidatePropertySym->m_id);
    } NEXT_SLIST_ENTRY_EDITING;
}